

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

int Gia_ManLevelWithBoxes_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *__function;
  char *__file;
  char *__assertion;
  
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
    iVar2 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= iVar2) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x25e,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (p->pTravIds[iVar2] == p->nTravIds) {
      return 0;
    }
    p->pTravIds[iVar2] = p->nTravIds;
    uVar3 = (uint)*(undefined8 *)pObj;
    if ((~uVar3 & 0x9fffffff) == 0) {
      return 1;
    }
    if (((int)uVar3 < 0) ||
       (uVar4 = (ulong)(uVar3 & 0x1fffffff), (uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assertion = "Gia_ObjIsAnd(pObj)";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaTim.c";
      __function = "int Gia_ManLevelWithBoxes_rec(Gia_Man_t *, Gia_Obj_t *)";
      goto LAB_0022dc78;
    }
    if (pObj < pGVar1 + p->nObjs) {
      if (p->pSibls != (int *)0x0) {
        uVar3 = p->pSibls[iVar2];
        if ((ulong)uVar3 != 0) {
          if (((int)uVar3 < 0) || (p->nObjs <= (int)uVar3)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                          ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          Gia_ManLevelWithBoxes_rec(p,pGVar1 + uVar3);
          uVar4 = (ulong)((uint)*(undefined8 *)pObj & 0x1fffffff);
        }
      }
      iVar2 = Gia_ManLevelWithBoxes_rec(p,pObj + -uVar4);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = Gia_ManLevelWithBoxes_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
      if (iVar2 != 0) {
        return 1;
      }
      Gia_ObjSetAndLevel(p,pObj);
      return 0;
    }
  }
  __assertion = "p->pObjs <= pObj && pObj < p->pObjs + p->nObjs";
  __file = "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h";
  __function = "int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)";
LAB_0022dc78:
  __assert_fail(__assertion,__file,0x1d4,__function);
}

Assistant:

int Gia_ManLevelWithBoxes_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 1;
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        Gia_ManLevelWithBoxes_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)) );
    if ( Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) ) )
        return 1;
    if ( Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin1(pObj) ) )
        return 1;
    Gia_ObjSetAndLevel( p, pObj );
    return 0;
}